

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

Btree tree_5_3::search_2(Btree t,int e)

{
  Btree p;
  
  for (; (t != (Btree)0x0 && (t->data != e)); t = (&t->left)[t->data <= e]) {
  }
  return t;
}

Assistant:

Btree search_2(Btree t, int e) {
        Btree p = t;
        while (p != nullptr && p->data != e) {
            if (e < p->data)
                p = p->left;
            else
                p = p->right;
        }
        return p;
    }